

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O0

void __thiscall btRigidBody::applyDamping(btRigidBody *this,btScalar timeStep)

{
  long in_RDI;
  btScalar bVar1;
  btVector3 dir_1;
  btScalar angDampVel;
  btScalar angSpeed;
  btVector3 dir;
  btScalar dampVel;
  btScalar speed;
  btScalar local_7c;
  btScalar in_stack_ffffffffffffff88;
  btScalar in_stack_ffffffffffffff8c;
  btVector3 *in_stack_ffffffffffffff90;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btVector3 local_3c;
  btScalar local_2c [4];
  undefined4 local_1c;
  btScalar local_18;
  btScalar local_14;
  btScalar local_10 [4];
  
  local_10[0] = btPow(0.0,3.217107e-39);
  btVector3::operator*=((btVector3 *)(in_RDI + 0x17c),local_10);
  local_14 = btPow(0.0,3.217188e-39);
  btVector3::operator*=((btVector3 *)(in_RDI + 0x18c),&local_14);
  if ((*(byte *)(in_RDI + 0x208) & 1) != 0) {
    bVar1 = btVector3::length2((btVector3 *)0x230872);
    if ((bVar1 < *(float *)(in_RDI + 0x214)) &&
       (bVar1 = btVector3::length2((btVector3 *)0x230896), bVar1 < *(float *)(in_RDI + 0x210))) {
      btVector3::operator*=((btVector3 *)(in_RDI + 0x18c),(btScalar *)(in_RDI + 0x20c));
      btVector3::operator*=((btVector3 *)(in_RDI + 0x17c),(btScalar *)(in_RDI + 0x20c));
    }
    local_18 = btVector3::length((btVector3 *)0x2308ee);
    if (local_18 < *(float *)(in_RDI + 0x200)) {
      local_1c = 0x3ba3d70a;
      if (local_18 <= 0.005) {
        local_40 = 0.0;
        local_44 = 0.0;
        local_48 = 0.0;
        btVector3::setValue((btVector3 *)(in_RDI + 0x17c),&local_40,&local_44,&local_48);
      }
      else {
        local_2c = (btScalar  [4])
                   btVector3::normalized
                             ((btVector3 *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        local_3c = ::operator*(in_stack_ffffffffffffff90,
                               (btScalar *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        btVector3::operator-=((btVector3 *)(in_RDI + 0x17c),&local_3c);
      }
    }
    bVar1 = btVector3::length((btVector3 *)0x2309c4);
    if (bVar1 < *(float *)(in_RDI + 0x204)) {
      if (bVar1 <= 0.005) {
        local_7c = 0.0;
        btVector3::setValue((btVector3 *)(in_RDI + 0x18c),(btScalar *)&stack0xffffffffffffff8c,
                            (btScalar *)&stack0xffffffffffffff88,&local_7c);
      }
      else {
        btVector3::normalized
                  ((btVector3 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        ::operator*(in_stack_ffffffffffffff90,
                    (btScalar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        btVector3::operator-=((btVector3 *)(in_RDI + 0x18c),(btVector3 *)&stack0xffffffffffffff90);
      }
    }
  }
  return;
}

Assistant:

void			btRigidBody::applyDamping(btScalar timeStep)
{
	//On new damping: see discussion/issue report here: http://code.google.com/p/bullet/issues/detail?id=74
	//todo: do some performance comparisons (but other parts of the engine are probably bottleneck anyway

//#define USE_OLD_DAMPING_METHOD 1
#ifdef USE_OLD_DAMPING_METHOD
	m_linearVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_linearDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
	m_angularVelocity *= GEN_clamped((btScalar(1.) - timeStep * m_angularDamping), (btScalar)btScalar(0.0), (btScalar)btScalar(1.0));
#else
	m_linearVelocity *= btPow(btScalar(1)-m_linearDamping, timeStep);
	m_angularVelocity *= btPow(btScalar(1)-m_angularDamping, timeStep);
#endif

	if (m_additionalDamping)
	{
		//Additional damping can help avoiding lowpass jitter motion, help stability for ragdolls etc.
		//Such damping is undesirable, so once the overall simulation quality of the rigid body dynamics system has improved, this should become obsolete
		if ((m_angularVelocity.length2() < m_additionalAngularDampingThresholdSqr) &&
			(m_linearVelocity.length2() < m_additionalLinearDampingThresholdSqr))
		{
			m_angularVelocity *= m_additionalDampingFactor;
			m_linearVelocity *= m_additionalDampingFactor;
		}
	

		btScalar speed = m_linearVelocity.length();
		if (speed < m_linearDamping)
		{
			btScalar dampVel = btScalar(0.005);
			if (speed > dampVel)
			{
				btVector3 dir = m_linearVelocity.normalized();
				m_linearVelocity -=  dir * dampVel;
			} else
			{
				m_linearVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}

		btScalar angSpeed = m_angularVelocity.length();
		if (angSpeed < m_angularDamping)
		{
			btScalar angDampVel = btScalar(0.005);
			if (angSpeed > angDampVel)
			{
				btVector3 dir = m_angularVelocity.normalized();
				m_angularVelocity -=  dir * angDampVel;
			} else
			{
				m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
			}
		}
	}
}